

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O2

SPxId __thiscall
soplex::SPxSteepPR<double>::selectEnterHyperCoDim(SPxSteepPR<double> *this,double *best,double tol)

{
  double dVar1;
  int iVar2;
  int iVar3;
  SPxSolverBase<double> *pSVar4;
  pointer pdVar5;
  pointer pdVar6;
  int *piVar7;
  SPxId SVar8;
  DataKey DVar9;
  ulong uVar10;
  ulong uVar11;
  int i;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  
  pSVar4 = (this->super_SPxPricer<double>).thesolver;
  pdVar5 = (pSVar4->theTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar6 = (pSVar4->weights).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar10 = (ulong)(uint)(this->bestPricesCo).super_IdxSet.num;
  dVar15 = *best;
  piVar7 = (this->bestPricesCo).super_IdxSet.idx;
  i = -1;
  dVar1 = -1.0;
  do {
    dVar12 = dVar1;
    uVar11 = uVar10 & 0xffffffff;
    while( true ) {
      uVar10 = uVar10 - 1;
      if ((int)uVar11 < 1) {
        uVar10 = (ulong)(uint)(pSVar4->updateViolsCo).super_IdxSet.num;
        goto LAB_00201682;
      }
      iVar2 = piVar7[uVar10];
      dVar1 = pdVar5[iVar2];
      if (dVar1 < -tol) break;
      iVar3 = (this->bestPricesCo).super_IdxSet.num;
      (this->bestPricesCo).super_IdxSet.num = iVar3 + -1;
      piVar7[uVar10] = piVar7[(long)iVar3 + -1];
      (pSVar4->isInfeasibleCo).data[iVar2] = 0;
      uVar11 = (ulong)((int)uVar11 - 1);
    }
    dVar14 = pdVar6[iVar2];
    dVar13 = tol;
    if (tol <= dVar14) {
      dVar13 = dVar14;
    }
    dVar13 = (dVar1 * dVar1) / dVar13;
    if (dVar15 < dVar13) {
      *best = dVar13;
      dVar15 = dVar13;
      i = iVar2;
    }
    dVar1 = dVar13;
    if ((0.0 <= dVar12) && (dVar1 = dVar12, dVar13 < dVar12)) {
      dVar1 = dVar13;
    }
  } while( true );
LAB_00201682:
  pSVar4 = (this->super_SPxPricer<double>).thesolver;
  uVar11 = uVar10 & 0xffffffff;
  do {
    uVar10 = uVar10 - 1;
    if ((int)uVar11 < 1) {
      if (i < 0) {
        DVar9.info = 0;
        DVar9.idx = -1;
        return (SPxId)DVar9;
      }
      SVar8 = SPxSolverBase<double>::id((this->super_SPxPricer<double>).thesolver,i);
      return (SPxId)SVar8.super_DataKey;
    }
    piVar7 = (pSVar4->isInfeasibleCo).data;
    iVar2 = (pSVar4->updateViolsCo).super_IdxSet.idx[uVar10];
    if (piVar7[iVar2] == 1) {
      dVar15 = pdVar5[iVar2];
      if (-tol <= dVar15) {
        piVar7[iVar2] = 0;
      }
      else {
        dVar1 = pdVar6[iVar2];
        dVar14 = tol;
        if (tol <= dVar1) {
          dVar14 = dVar1;
        }
        dVar14 = (dVar15 * dVar15) / dVar14;
        if (dVar12 < dVar14) break;
      }
    }
    uVar11 = (ulong)((int)uVar11 - 1);
  } while( true );
  if (*best <= dVar14 && dVar14 != *best) {
    *best = dVar14;
    i = iVar2;
  }
  piVar7[iVar2] = 2;
  DIdxSet::addIdx(&this->bestPricesCo,iVar2);
  goto LAB_00201682;
}

Assistant:

SPxId SPxSteepPR<R>::selectEnterHyperCoDim(R& best, R tol)
{
   const R* test        = this->thesolver->test().get_const_ptr();
   const R* weights_ptr = this->thesolver->weights.get_const_ptr();

   R leastBest = -1;
   R x;
   int enterIdx = -1;
   int idx;

   // find the best price from short candidate list
   for(int i = bestPricesCo.size() - 1; i >= 0; --i)
   {
      idx = bestPricesCo.index(i);
      x = test[idx];

      if(x < -tol)
      {
         x = steeppr::computePrice(x, weights_ptr[idx], tol);

         assert(x >= 0);

         // update the best price of candidate list
         if(x > best)
         {
            best = x;
            enterIdx = idx;
         }

         // update the smallest price of candidate list
         if(x < leastBest || leastBest < 0)
            leastBest = x;
      }
      else
      {
         bestPricesCo.remove(i);
         this->thesolver->isInfeasibleCo[idx] = this->NOT_VIOLATED;
      }
   }

   // scan the updated indices for a better price
   for(int i = this->thesolver->updateViolsCo.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->updateViolsCo.index(i);

      // only look at indices that were not checked already
      if(this->thesolver->isInfeasibleCo[idx] == this->VIOLATED)
      {
         x = test[idx];

         if(x < -tol)
         {
            x = steeppr::computePrice(x, weights_ptr[idx], tol);

            if(x > leastBest)
            {
               if(x > best)
               {
                  best = x;
                  enterIdx = idx;
               }

               // put index into candidate list
               this->thesolver->isInfeasibleCo[idx] = this->VIOLATED_AND_CHECKED;
               bestPricesCo.addIdx(idx);
            }
         }
         else
         {
            this->thesolver->isInfeasibleCo[idx] = this->NOT_VIOLATED;
         }
      }
   }

   if(enterIdx >= 0)
      return this->thesolver->id(enterIdx);
   else
      return SPxId();
}